

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

Export * __thiscall
wasm::Module::addExport
          (Module *this,unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *curr)

{
  Export *pEVar1;
  allocator<char> local_41;
  string local_40;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> local_20;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *local_18;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *curr_local;
  Module *this_local;
  
  local_18 = curr;
  curr_local = (unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)this;
  std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::unique_ptr(&local_20,curr);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"addExport",&local_41);
  pEVar1 = addModuleElement<std::vector<std::unique_ptr<wasm::Export,std::default_delete<wasm::Export>>,std::allocator<std::unique_ptr<wasm::Export,std::default_delete<wasm::Export>>>>,std::unordered_map<wasm::Name,wasm::Export*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Export*>>>,wasm::Export>
                     (&this->exports,&this->exportsMap,&local_20,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr(&local_20);
  return pEVar1;
}

Assistant:

Export* Module::addExport(std::unique_ptr<Export>&& curr) {
  return addModuleElement(exports, exportsMap, std::move(curr), "addExport");
}